

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.h
# Opt level: O3

float __thiscall
lunasvg::LengthContext::valueForLength(LengthContext *this,Length *length,LengthDirection direction)

{
  float fVar1;
  LengthUnits LVar2;
  Size SVar3;
  float fVar4;
  
  LVar2 = length->m_units;
  if (LVar2 == Ex) {
    return length->m_value * this->m_element->m_font_size * 0.5;
  }
  if (LVar2 == Em) {
    return length->m_value * this->m_element->m_font_size;
  }
  if (LVar2 != Percent) {
    return length->m_value;
  }
  fVar1 = length->m_value;
  if (this->m_units != UserSpaceOnUse) {
    return fVar1 / 100.0;
  }
  SVar3 = SVGElement::currentViewportSize(this->m_element);
  fVar4 = SVar3.h;
  if (direction == Vertical) {
    SVar3.h = 0.0;
    SVar3.w = fVar4;
  }
  else if (direction != Horizontal) {
    SVar3.w = SQRT(SVar3.w * SVar3.w + fVar4 * fVar4) / 1.4142135;
    SVar3.h = 0.0;
  }
  return (fVar1 * SVar3.w) / 100.0;
}

Assistant:

float value() const { return m_value; }